

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  bool bVar1;
  int iVar2;
  lzham_compress_level lVar3;
  int iVar4;
  uint __seed;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 uVar12;
  int in_ESI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  double dVar13;
  char decomp_file [256];
  bool comp_result;
  string *cmp_file;
  string *src_file;
  int exit_status;
  int seed;
  int num_threads;
  int comp_level;
  int dict_size;
  string *str;
  int i;
  op_mode_t op_mode;
  comp_options options;
  comp_options *in_stack_000005c0;
  ilzham *in_stack_000005c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd68;
  comp_options *in_stack_fffffffffffffd70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd80;
  const_iterator in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  char local_1b8 [104];
  comp_options *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  ilzham *in_stack_fffffffffffffec8;
  comp_options in_stack_fffffffffffffee0;
  uint local_9c;
  int local_3c;
  comp_options local_38;
  int local_14;
  uint local_4;
  
  local_14 = in_ESI;
  comp_options::comp_options(&local_38);
  local_38.m_max_helper_threads = local_14;
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar6 == 0) {
    print_usage();
    local_4 = simple_test(in_stack_000005c8,in_stack_000005c0);
  }
  else {
    local_3c = -1;
    while (sVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(in_RDI), 0 < (int)sVar6) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RDI,0);
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
      if (*pcVar8 != '-') {
        lVar11 = std::__cxx11::string::size();
        if (lVar11 != 1) {
          uVar10 = std::__cxx11::string::c_str();
          print_error("Invalid mode: %s\n",uVar10);
          return 1;
        }
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
        iVar5 = tolower((int)*pcVar8);
        if (iVar5 == 0x61) {
          local_3c = 2;
        }
        else if (iVar5 == 99) {
          local_3c = 0;
        }
        else {
          if (iVar5 != 100) {
            uVar10 = std::__cxx11::string::c_str();
            print_error("Invalid mode: %s\n",uVar10);
            return 1;
          }
          local_3c = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::begin(in_stack_fffffffffffffd68);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator+(in_stack_fffffffffffffd78,(difference_type)in_stack_fffffffffffffd70);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffd70,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffd68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
        break;
      }
      uVar9 = std::__cxx11::string::size();
      if (uVar9 < 2) {
        uVar10 = std::__cxx11::string::c_str();
        print_error("Invalid option: %s\n",uVar10);
        return 1;
      }
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar7);
      iVar2 = tolower((int)*pcVar8);
      lVar3 = local_38.m_comp_level;
      iVar5 = local_38.m_dict_size_log2;
      iVar4 = local_38.m_max_helper_threads;
      switch(iVar2) {
      case 99:
        local_38._8_4_ = local_38._8_4_ & 0xffffff00;
        break;
      case 100:
        lVar11 = std::__cxx11::string::c_str();
        iVar5 = atoi((char *)(lVar11 + 2));
        if ((iVar5 < 0xf) ||
           (lVar3 = local_38.m_comp_level, iVar4 = local_38.m_max_helper_threads, 0x1d < iVar5)) {
          uVar10 = std::__cxx11::string::c_str();
          print_error("Invalid dictionary size: %s\n",uVar10);
          return 1;
        }
        break;
      case 0x65:
        local_38.m_deterministic_parsing = true;
        break;
      default:
        uVar10 = std::__cxx11::string::c_str();
        print_error("Invalid option: %s\n",uVar10);
        return 1;
      case 0x6d:
        lVar11 = std::__cxx11::string::c_str();
        lVar3 = atoi((char *)(lVar11 + 2));
        if (((int)lVar3 < 0) ||
           (iVar5 = local_38.m_dict_size_log2, iVar4 = local_38.m_max_helper_threads, 4 < (int)lVar3
           )) {
          uVar10 = std::__cxx11::string::c_str();
          print_error("Invalid compression level: %s\n",uVar10);
          return 1;
        }
        break;
      case 0x70:
        local_38.m_force_polar_codes = true;
        break;
      case 0x72:
        local_38.m_randomize_params = true;
        break;
      case 0x73:
        lVar11 = std::__cxx11::string::c_str();
        __seed = atoi((char *)(lVar11 + 2));
        srand(__seed);
        printf("Using random seed: %i\n",(ulong)__seed);
        lVar3 = local_38.m_comp_level;
        iVar5 = local_38.m_dict_size_log2;
        iVar4 = local_38.m_max_helper_threads;
        break;
      case 0x74:
        lVar11 = std::__cxx11::string::c_str();
        iVar4 = atoi((char *)(lVar11 + 2));
        if ((iVar4 < 0) ||
           (lVar3 = local_38.m_comp_level, iVar5 = local_38.m_dict_size_log2, 0x10 < iVar4)) {
          uVar10 = std::__cxx11::string::c_str();
          print_error("Invalid number of helper threads: %s\n",uVar10);
          return 1;
        }
        break;
      case 0x75:
        local_38.m_unbuffered_decompression = true;
        break;
      case 0x76:
        local_38.m_verify_compressed_data = true;
        break;
      case 0x78:
        local_38.m_extreme_parsing = true;
      }
      local_38.m_max_helper_threads = iVar4;
      local_38.m_dict_size_log2 = iVar5;
      local_38.m_comp_level = lVar3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin(in_stack_fffffffffffffd68);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator+(in_stack_fffffffffffffd78,(difference_type)in_stack_fffffffffffffd70);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd70,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffd68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
    }
    if (local_3c == -1) {
      print_error("No mode specified!\n");
      print_usage();
      local_4 = 1;
    }
    else {
      printf("Using options:\n");
      comp_options::print(in_stack_fffffffffffffd70);
      printf("\n");
      if (local_3c == 0) {
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        if (sVar6 < 2) {
          print_error("Must specify input and output filenames!\n");
          return 1;
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        if (2 < sVar6) {
          print_error("Too many filenames!\n");
          return 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,1);
        std::__cxx11::string::c_str();
        std::__cxx11::string::c_str();
        bVar1 = compress_streaming(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                   in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        local_9c = (uint)!bVar1;
        if ((bVar1) && ((local_38.m_verify_compressed_data & 1U) != 0)) {
          dVar13 = timer::get_ms();
          sprintf(local_1b8,"__decomp_temp_%u__.tmp",(long)dVar13 & 0xffffffff);
          std::__cxx11::string::c_str();
          bVar1 = decompress_file(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                  in_stack_fffffffffffffeb8,in_stack_fffffffffffffee0);
          if (!bVar1) {
            uVar10 = std::__cxx11::string::c_str();
            print_error("Failed decompressing file \"%s\" to \"%s\"\n",uVar10,local_1b8);
            return 1;
          }
          uVar10 = std::__cxx11::string::c_str();
          printf("Comparing file \"%s\" to \"%s\"\n",local_1b8,uVar10);
          std::__cxx11::string::c_str();
          bVar1 = compare_files(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          if (!bVar1) {
            uVar10 = std::__cxx11::string::c_str();
            uVar12 = std::__cxx11::string::c_str();
            print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n"
                        ,uVar10,uVar12);
            return 1;
          }
          printf("Decompressed file compared OK to original file.\n");
          remove(local_1b8);
        }
      }
      else if (local_3c == 1) {
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        if (sVar6 < 2) {
          print_error("Must specify input and output filenames!\n");
          return 1;
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        if (2 < sVar6) {
          print_error("Too many filenames!\n");
          return 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,0);
        std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,1);
        std::__cxx11::string::c_str();
        bVar1 = decompress_file(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                in_stack_fffffffffffffeb8,in_stack_fffffffffffffee0);
        local_9c = (uint)!bVar1;
      }
      else {
        if (local_3c != 2) {
          print_error("No mode specified!\n");
          print_usage();
          return 1;
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        if (sVar6 == 0) {
          print_error("No directory specified!\n");
          return 1;
        }
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_RDI);
        if (sVar6 != 1) {
          print_error("Too many filenames!\n");
          return 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,0);
        std::__cxx11::string::c_str();
        bVar1 = test_recursive((ilzham *)decomp_file._88_8_,(char *)decomp_file._80_8_,
                               (comp_options)decomp_file._112_24_);
        local_9c = (uint)!bVar1;
      }
      local_4 = local_9c;
    }
  }
  return local_4;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (tolower(str[1]))
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'p':
            {
               options.m_force_polar_codes = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;
               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_streaming(lzham_dll, src_file.c_str(), cmp_file.c_str(), options);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}